

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_const_array(Context *ctx,ConstantsList *clist,int base,int size)

{
  char *pcVar1;
  char local_f8 [8];
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  int i;
  char *cstr;
  char varname [64];
  int size_local;
  int base_local;
  ConstantsList *clist_local;
  Context *ctx_local;
  
  get_METAL_const_array_varname_in_buf(ctx,base,size,(char *)&cstr,0x40);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"const float4 %s[%d] = {",&cstr,(ulong)(uint)size);
  ctx->indent = ctx->indent + 1;
  val0[0x1c] = '\0';
  val0[0x1d] = '\0';
  val0[0x1e] = '\0';
  val0[0x1f] = '\0';
  _size_local = clist;
  while( true ) {
    if (size <= (int)val0._28_4_) {
      ctx->indent = ctx->indent + -1;
      output_line(ctx,"};");
      output_line(ctx,"(void) %s[0];",&cstr);
      pop_output(ctx);
      return;
    }
    for (; (_size_local->constant).type != MOJOSHADER_UNIFORM_FLOAT; _size_local = _size_local->next
        ) {
    }
    if ((_size_local->constant).index != base + val0._28_4_) break;
    floatstr(ctx,val1 + 0x18,0x20,(_size_local->constant).value.f[0],1);
    floatstr(ctx,val2 + 0x18,0x20,(_size_local->constant).value.f[1],1);
    floatstr(ctx,val3 + 0x18,0x20,(_size_local->constant).value.f[2],1);
    floatstr(ctx,local_f8,0x20,(_size_local->constant).value.f[3],1);
    pcVar1 = "";
    if ((int)val0._28_4_ < size + -1) {
      pcVar1 = ",";
    }
    output_line(ctx,"float4(%s, %s, %s, %s)%s",val1 + 0x18,val2 + 0x18,val3 + 0x18,local_f8,pcVar1);
    _size_local = _size_local->next;
    val0._28_4_ = val0._28_4_ + 1;
  }
  __assert_fail("clist->constant.index == (base + i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x126e,"void emit_METAL_const_array(Context *, const ConstantsList *, int, int)");
}

Assistant:

static void emit_METAL_const_array(Context *ctx, const ConstantsList *clist,
                                   int base, int size)
{
    char varname[64];
    get_METAL_const_array_varname_in_buf(ctx,base,size,varname,sizeof(varname));

    const char *cstr = NULL;
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    output_line(ctx, "const float4 %s[%d] = {", varname, size);
    ctx->indent++;

    int i;
    for (i = 0; i < size; i++)
    {
        while (clist->constant.type != MOJOSHADER_UNIFORM_FLOAT)
            clist = clist->next;
        assert(clist->constant.index == (base + i));

        char val0[32];
        char val1[32];
        char val2[32];
        char val3[32];
        floatstr(ctx, val0, sizeof (val0), clist->constant.value.f[0], 1);
        floatstr(ctx, val1, sizeof (val1), clist->constant.value.f[1], 1);
        floatstr(ctx, val2, sizeof (val2), clist->constant.value.f[2], 1);
        floatstr(ctx, val3, sizeof (val3), clist->constant.value.f[3], 1);

        output_line(ctx, "float4(%s, %s, %s, %s)%s", val0, val1, val2, val3,
                        (i < (size-1)) ? "," : "");

        clist = clist->next;
    } // for

    ctx->indent--;
    output_line(ctx, "};");
    output_line(ctx, "(void) %s[0];", varname);  // stop compiler warnings.
    pop_output(ctx);
}